

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cleanup_with_absolute_prefix_unittest.cc
# Opt level: O1

int main(int argc,char **argv)

{
  pointer *ppcVar1;
  LogMessageTime *pLVar2;
  undefined8 uVar3;
  bool bVar4;
  CapturedStream *pCVar5;
  FILE *__stream;
  size_type __n;
  size_t sVar6;
  ostream *poVar7;
  undefined8 extraout_RAX;
  ulong uVar8;
  undefined8 *puVar9;
  pointer __old_p;
  unique_ptr<google::CapturedStream,_std::default_delete<google::CapturedStream>_> cap;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string early_stderr;
  CapturedStream *local_b0;
  vector<char,_std::allocator<char>_> local_a8;
  LogMessage local_88;
  
  fLB::FLAGS_colorlogtostderr = 0;
  fLB::FLAGS_timestamp_in_logfile_name = 1;
  setbuf(_stderr,(char *)0x0);
  ppcVar1 = &local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)ppcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,fLS::FLAGS_test_tmpdir_buf_abi_cxx11_,
             DAT_00130998 + fLS::FLAGS_test_tmpdir_buf_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_a8);
  if (google::s_captured_streams._16_8_ == 0) {
    pCVar5 = (CapturedStream *)operator_new(0x28);
    pLVar2 = &local_88.time_;
    local_88.allocated_ = (LogMessageData *)pLVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,
               local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start,
               local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish +
               (long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start);
    google::CapturedStream::CapturedStream(pCVar5,2,(string *)&local_88);
    local_b0 = pCVar5;
    if (local_88.allocated_ != (LogMessageData *)pLVar2) {
      free(local_88.allocated_);
    }
    pCVar5 = local_b0;
    uVar3 = google::s_captured_streams._16_8_;
    local_b0 = (CapturedStream *)0x0;
    google::s_captured_streams._16_8_ = pCVar5;
    if (uVar3 != 0) {
      std::default_delete<google::CapturedStream>::operator()
                ((default_delete<google::CapturedStream> *)(google::s_captured_streams + 0x10),
                 (CapturedStream *)uVar3);
    }
    if (local_b0 != (CapturedStream *)0x0) {
      std::default_delete<google::CapturedStream>::operator()
                ((default_delete<google::CapturedStream> *)&local_b0,local_b0);
    }
    if ((pointer *)
        local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != ppcVar1) {
      free(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start);
    }
    uVar3 = google::s_captured_streams._16_8_;
    local_b0 = (CapturedStream *)google::s_captured_streams._16_8_;
    google::s_captured_streams._16_8_ = 0;
    if (uVar3 != 0) {
      google::CapturedStream::StopCapture((CapturedStream *)uVar3);
      __stream = fopen((local_b0->filename_)._M_dataplus._M_p,"r");
      fseek(__stream,0,2);
      __n = ftell(__stream);
      std::vector<char,_std::allocator<char>_>::vector(&local_a8,__n,(allocator_type *)&local_88);
      uVar8 = 0;
      fseek(__stream,0,0);
      do {
        sVar6 = fread((undefined1 *)
                      ((long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start + uVar8),1,__n - uVar8,__stream);
        uVar8 = uVar8 + sVar6;
        if (sVar6 == 0) break;
      } while (uVar8 < __n);
      local_88.allocated_ = (LogMessageData *)pLVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,
                 local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (undefined1 *)
                 ((long)local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start + uVar8));
      if ((pointer *)
          local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0) {
        free(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
      }
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      if (local_b0 != (CapturedStream *)0x0) {
        std::default_delete<google::CapturedStream>::operator()
                  ((default_delete<google::CapturedStream> *)&local_b0,local_b0);
      }
      bVar4 = google::IsGoogleLoggingInitialized();
      if (bVar4) {
        main_cold_3();
      }
      else {
        google::InitGoogleLogging(*argv);
        bVar4 = google::IsGoogleLoggingInitialized();
        puVar9 = google::g_testlist;
        if (bVar4) {
          for (; puVar9 != DAT_001309e8; puVar9 = puVar9 + 1) {
            (*(code *)*puVar9)();
          }
          main_cold_2();
          return 0;
        }
      }
      main_cold_1();
      if ((pointer *)
          local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer *)0x0) {
        free(local_a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start);
      }
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      if (local_b0 != (CapturedStream *)0x0) {
        std::default_delete<google::CapturedStream>::operator()
                  ((default_delete<google::CapturedStream> *)&local_b0,local_b0);
      }
      _Unwind_Resume(extraout_RAX);
    }
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x183);
    poVar7 = google::LogMessage::stream(&local_88);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"Check failed: cap ",0x12);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,": did you forget CaptureTestStdout() or CaptureTestStderr()?",0x3c);
  }
  else {
    google::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_88,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sergiud[P]glog/src/googletest.h"
               ,0x15c);
    poVar7 = google::LogMessage::stream(&local_88);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"Check failed: s_captured_streams[fd] == nullptr ",0x30);
  }
  google::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_88);
}

Assistant:

int main(int argc, char** argv) {
  FLAGS_colorlogtostderr = false;
  FLAGS_timestamp_in_logfile_name = true;
#ifdef GLOG_USE_GFLAGS
  ParseCommandLineFlags(&argc, &argv, true);
#endif
  // Make sure stderr is not buffered as stderr seems to be buffered
  // on recent windows.
  setbuf(stderr, nullptr);

  // Test some basics before InitGoogleLogging:
  CaptureTestStderr();
  const string early_stderr = GetCapturedTestStderr();

  EXPECT_FALSE(IsGoogleLoggingInitialized());

  InitGoogleLogging(argv[0]);

  EXPECT_TRUE(IsGoogleLoggingInitialized());

  InitGoogleTest(&argc, argv);
#ifdef HAVE_LIB_GMOCK
  InitGoogleMock(&argc, argv);
#endif

  // so that death tests run before we use threads
  CHECK_EQ(RUN_ALL_TESTS(), 0);
}